

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O3

void __thiscall
kj::_::HeapDisposer<capnp::_::(anonymous_namespace)::TestNetworkAdapter>::disposeImpl
          (HeapDisposer<capnp::_::(anonymous_namespace)::TestNetworkAdapter> *this,void *pointer)

{
  _Base_ptr p_Var1;
  size_t sVar2;
  _Base_ptr p_Var3;
  _Rb_tree_node_base *p_Var4;
  char (*in_RCX) [23];
  _Link_type __x;
  Exception exception;
  String local_458;
  Exception local_438;
  Exception local_2e0;
  Exception local_188;
  
  if (pointer != (void *)0x0) {
    Debug::makeDescription<char_const(&)[23]>
              (&local_458,(Debug *)"\"Network was destroyed.\"","Network was destroyed.",in_RCX);
    Exception::Exception
              (&local_2e0,FAILED,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc-test.c++"
               ,0xcc,&local_458);
    sVar2 = local_458.content.size_;
    __x = (_Link_type)local_458.content.ptr;
    if ((_Link_type)local_458.content.ptr != (_Link_type)0x0) {
      local_458.content.ptr = (char *)0x0;
      local_458.content.size_ = 0;
      (**(local_458.content.disposer)->_vptr_ArrayDisposer)
                (local_458.content.disposer,__x,1,sVar2,sVar2,0);
    }
    p_Var4 = *(_Rb_tree_node_base **)((long)pointer + 0x30);
    if (p_Var4 != (_Rb_tree_node_base *)((long)pointer + 0x20)) {
      do {
        p_Var1 = p_Var4[1]._M_left;
        Exception::Exception(&local_438,&local_2e0);
        p_Var3 = p_Var1[0xd]._M_parent;
        if (p_Var1[0xe]._M_parent != p_Var3) {
          do {
            p_Var3 = p_Var3->_M_parent;
            Exception::Exception(&local_188,&local_438);
            (**(code **)(*(long *)p_Var3 + 8))(p_Var3,&local_188);
            Exception::~Exception(&local_188);
            std::
            deque<kj::Own<kj::PromiseFulfiller<kj::Maybe<kj::Own<capnp::IncomingRpcMessage>_>_>_>,_std::allocator<kj::Own<kj::PromiseFulfiller<kj::Maybe<kj::Own<capnp::IncomingRpcMessage>_>_>_>_>_>
            ::pop_front((deque<kj::Own<kj::PromiseFulfiller<kj::Maybe<kj::Own<capnp::IncomingRpcMessage>_>_>_>,_std::allocator<kj::Own<kj::PromiseFulfiller<kj::Maybe<kj::Own<capnp::IncomingRpcMessage>_>_>_>_>_>
                         *)&p_Var1[0xc]._M_right);
            p_Var3 = p_Var1[0xd]._M_parent;
          } while (p_Var1[0xe]._M_parent != p_Var3);
        }
        if (*(char *)&p_Var1[1]._M_right == '\x01') {
          *(undefined1 *)&p_Var1[1]._M_right = 0;
          Exception::~Exception((Exception *)(p_Var1 + 2));
        }
        *(char **)(p_Var1 + 2) = local_438.ownFile.content.ptr;
        p_Var1[2]._M_parent = (_Base_ptr)local_438.ownFile.content.size_;
        p_Var1[2]._M_left = (_Base_ptr)local_438.ownFile.content.disposer;
        local_438.ownFile.content.ptr = (char *)0x0;
        local_438.ownFile.content.size_ = 0;
        p_Var1[2]._M_right = (_Base_ptr)local_438.file;
        p_Var1[3]._M_color = local_438.line;
        *(Type *)&p_Var1[3].field_0x4 = local_438.type;
        p_Var1[3]._M_parent = (_Base_ptr)local_438.description.content.ptr;
        p_Var1[3]._M_left = (_Base_ptr)local_438.description.content.size_;
        local_438.description.content.ptr = (char *)0x0;
        local_438.description.content.size_ = 0;
        p_Var1[3]._M_right = (_Base_ptr)local_438.description.content.disposer;
        *(Disposer **)(p_Var1 + 4) = local_438.context.ptr.disposer;
        p_Var1[4]._M_parent = (_Base_ptr)local_438.context.ptr.ptr;
        local_438.context.ptr.ptr = (Context *)0x0;
        memcpy(&p_Var1[4]._M_left,local_438.trace,0x104);
        *(undefined1 *)&p_Var1[1]._M_right = 1;
        __x = (_Link_type)p_Var1[0x12]._M_left;
        if (__x != (_Link_type)0x0) {
          p_Var1[0x12]._M_left = (_Base_ptr)0x0;
          (*(code *)**(undefined8 **)p_Var1[0x12]._M_parent)();
        }
        Exception::~Exception(&local_438);
        p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4);
      } while (p_Var4 != (_Rb_tree_node_base *)((long)pointer + 0x20));
    }
    Exception::~Exception(&local_2e0);
    std::
    deque<kj::Own<capnp::VatNetwork<capnproto_test::capnp::test::TestSturdyRefHostId,_capnproto_test::capnp::test::TestProvisionId,_capnproto_test::capnp::test::TestRecipientId,_capnproto_test::capnp::test::TestThirdPartyCapId,_capnproto_test::capnp::test::TestJoinResult>::Connection>,_std::allocator<kj::Own<capnp::VatNetwork<capnproto_test::capnp::test::TestSturdyRefHostId,_capnproto_test::capnp::test::TestProvisionId,_capnproto_test::capnp::test::TestRecipientId,_capnproto_test::capnp::test::TestThirdPartyCapId,_capnproto_test::capnp::test::TestJoinResult>::Connection>_>_>
    ::~deque((deque<kj::Own<capnp::VatNetwork<capnproto_test::capnp::test::TestSturdyRefHostId,_capnproto_test::capnp::test::TestProvisionId,_capnproto_test::capnp::test::TestRecipientId,_capnproto_test::capnp::test::TestThirdPartyCapId,_capnproto_test::capnp::test::TestJoinResult>::Connection>,_std::allocator<kj::Own<capnp::VatNetwork<capnproto_test::capnp::test::TestSturdyRefHostId,_capnproto_test::capnp::test::TestProvisionId,_capnproto_test::capnp::test::TestRecipientId,_capnproto_test::capnp::test::TestThirdPartyCapId,_capnproto_test::capnp::test::TestJoinResult>::Connection>_>_>
              *)((long)pointer + 0x98));
    std::
    deque<kj::Own<kj::PromiseFulfiller<kj::Own<capnp::VatNetwork<capnproto_test::capnp::test::TestSturdyRefHostId,_capnproto_test::capnp::test::TestProvisionId,_capnproto_test::capnp::test::TestRecipientId,_capnproto_test::capnp::test::TestThirdPartyCapId,_capnproto_test::capnp::test::TestJoinResult>::Connection>_>_>,_std::allocator<kj::Own<kj::PromiseFulfiller<kj::Own<capnp::VatNetwork<capnproto_test::capnp::test::TestSturdyRefHostId,_capnproto_test::capnp::test::TestProvisionId,_capnproto_test::capnp::test::TestRecipientId,_capnproto_test::capnp::test::TestThirdPartyCapId,_capnproto_test::capnp::test::TestJoinResult>::Connection>_>_>_>_>
    ::~deque((deque<kj::Own<kj::PromiseFulfiller<kj::Own<capnp::VatNetwork<capnproto_test::capnp::test::TestSturdyRefHostId,_capnproto_test::capnp::test::TestProvisionId,_capnproto_test::capnp::test::TestRecipientId,_capnproto_test::capnp::test::TestThirdPartyCapId,_capnproto_test::capnp::test::TestJoinResult>::Connection>_>_>,_std::allocator<kj::Own<kj::PromiseFulfiller<kj::Own<capnp::VatNetwork<capnproto_test::capnp::test::TestSturdyRefHostId,_capnproto_test::capnp::test::TestProvisionId,_capnproto_test::capnp::test::TestRecipientId,_capnproto_test::capnp::test::TestThirdPartyCapId,_capnproto_test::capnp::test::TestJoinResult>::Connection>_>_>_>_>
              *)((long)pointer + 0x48));
    std::
    _Rb_tree<const_capnp::_::(anonymous_namespace)::TestNetworkAdapter_*,_std::pair<const_capnp::_::(anonymous_namespace)::TestNetworkAdapter_*const,_kj::Own<capnp::_::(anonymous_namespace)::TestNetworkAdapter::ConnectionImpl>_>,_std::_Select1st<std::pair<const_capnp::_::(anonymous_namespace)::TestNetworkAdapter_*const,_kj::Own<capnp::_::(anonymous_namespace)::TestNetworkAdapter::ConnectionImpl>_>_>,_std::less<const_capnp::_::(anonymous_namespace)::TestNetworkAdapter_*>,_std::allocator<std::pair<const_capnp::_::(anonymous_namespace)::TestNetworkAdapter_*const,_kj::Own<capnp::_::(anonymous_namespace)::TestNetworkAdapter::ConnectionImpl>_>_>_>
    ::_M_erase(*(_Rb_tree<const_capnp::_::(anonymous_namespace)::TestNetworkAdapter_*,_std::pair<const_capnp::_::(anonymous_namespace)::TestNetworkAdapter_*const,_kj::Own<capnp::_::(anonymous_namespace)::TestNetworkAdapter::ConnectionImpl>_>,_std::_Select1st<std::pair<const_capnp::_::(anonymous_namespace)::TestNetworkAdapter_*const,_kj::Own<capnp::_::(anonymous_namespace)::TestNetworkAdapter::ConnectionImpl>_>_>,_std::less<const_capnp::_::(anonymous_namespace)::TestNetworkAdapter_*>,_std::allocator<std::pair<const_capnp::_::(anonymous_namespace)::TestNetworkAdapter_*const,_kj::Own<capnp::_::(anonymous_namespace)::TestNetworkAdapter::ConnectionImpl>_>_>_>
                 **)((long)pointer + 0x28),__x);
  }
  operator_delete(pointer,0xe8);
  return;
}

Assistant:

virtual void disposeImpl(void* pointer) const override { delete reinterpret_cast<T*>(pointer); }